

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void P_TranslatePortalVXVY(line_t_conflict *src,double *velx,double *vely)

{
  FLinePortal *port;
  double dVar1;
  double dVar2;
  
  if ((src != (line_t_conflict *)0x0) &&
     (linePortals.Array != (FLinePortal *)0x0 && src->portalindex < linePortals.Count)) {
    port = linePortals.Array + src->portalindex;
    if ((port->mFlags & 0x10) != 0) {
      SetRotation(port);
    }
    dVar1 = *velx;
    dVar2 = *vely;
    *velx = port->mCosRot * dVar1 - port->mSinRot * dVar2;
    *vely = dVar1 * port->mSinRot + dVar2 * port->mCosRot;
  }
  return;
}

Assistant:

void P_TranslatePortalVXVY(line_t* src, double &velx, double &vely)
{
	if (!src) return;
	FLinePortal *port = src->getPortal();
	if (!port) return;
	if (port->mFlags & PORTF_POLYOBJ) SetRotation(port);	// update the angle for polyportals.

	double orig_velx = velx;
	double orig_vely = vely;
	velx = orig_velx * port->mCosRot - orig_vely * port->mSinRot;
	vely = orig_vely * port->mCosRot + orig_velx * port->mSinRot;
}